

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  double dVar3;
  short sVar4;
  ImGuiWindow *pIVar5;
  ImGuiTableTempData *pIVar6;
  ImGuiWindow *pIVar7;
  float *__src;
  void *pvVar8;
  ImGuiTableColumn *pIVar9;
  ImGuiContext *pIVar10;
  void *pvVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ImU32 IVar17;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiTableTempData *pIVar18;
  ImDrawListSplitter *pIVar19;
  float *__dest;
  void *ptr;
  ulong uVar20;
  ImGuiTableColumn *pIVar21;
  char *__dest_00;
  ImRect *pIVar22;
  char *pcVar23;
  ulong uVar24;
  ImGuiTableColumn *pIVar25;
  int iVar26;
  int iVar27;
  undefined4 in_register_00000034;
  ImGuiTableColumnFlags *pIVar28;
  int iVar29;
  ImGuiContext *g;
  long lVar30;
  int iVar31;
  long lVar32;
  byte bVar33;
  undefined4 in_XMM0_Db;
  ImVec2 IVar34;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  ImRect outer_rect;
  ImGuiID local_128;
  uint local_124;
  ImS16 local_118;
  ImRect local_108;
  ImGuiWindow *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  char *local_d8;
  ImVec2 *local_d0;
  ImVec2 local_c8;
  undefined8 uStack_c0;
  ImDrawListSplitter local_b8;
  undefined3 uStack_a0;
  undefined5 uStack_9d;
  undefined4 local_98;
  undefined4 local_94;
  undefined3 uStack_90;
  void *local_88;
  
  pIVar10 = GImGui;
  local_f0 = CONCAT44(in_register_00000034,id);
  bVar33 = 0;
  local_e8 = (ImGuiWindow *)CONCAT44(in_XMM0_Db,inner_width);
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  uVar24 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x143,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x145,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar34 = GetContentRegionAvail();
  fVar38 = IVar34.y;
  auVar37._8_4_ = (int)extraout_XMM0_Qb;
  auVar37._0_4_ = IVar34.x;
  auVar37._4_4_ = IVar34.y;
  auVar37._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  if (IVar34.x <= 1.0) {
    auVar37._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar34 = CalcItemSize(*outer_size,auVar37._0_4_,0.0);
    local_108.Min = (pIVar5->DC).CursorPos;
    local_108.Max.x = IVar34.x + local_108.Min.x;
    local_108.Max.y = IVar34.y + local_108.Min.y;
  }
  else {
    if (fVar38 <= 1.0) {
      fVar38 = 1.0;
    }
    IVar34 = CalcItemSize(*outer_size,auVar37._0_4_,fVar38);
    local_108.Min = (pIVar5->DC).CursorPos;
    local_108.Max.x = IVar34.x + local_108.Min.x;
    local_108.Max.y = IVar34.y + local_108.Min.y;
    bVar12 = IsClippedEx(&local_108,0,false);
    if (bVar12) {
      ItemSize(&local_108,-1.0);
      return false;
    }
  }
  local_128 = (ImGuiID)local_f0;
  local_d8 = name;
  local_d0 = outer_size;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar10->Tables,local_128);
  local_f8 = pIVar5;
  if (p_00->LastFrameActive == pIVar10->FrameCount) {
    sVar4 = p_00->InstanceCurrent;
    local_118 = sVar4 + 1;
    local_128 = (int)sVar4 + local_128 + 1;
    local_124 = p_00->Flags;
    if ((-1 < sVar4) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x158,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  else {
    local_124 = p_00->Flags;
    local_118 = 0;
  }
  uVar13 = ImPool<ImGuiTable>::GetIndex(&pIVar10->Tables,p_00);
  iVar31 = pIVar10->CurrentTableStackIdx;
  uVar14 = iVar31 + 1;
  pIVar10->CurrentTableStackIdx = uVar14;
  iVar26 = iVar31 + 2;
  iVar27 = (pIVar10->TablesTempDataStack).Size;
  if (iVar27 < iVar26) {
    memset(&local_c8,0,0x90);
    local_c8.y = -1.0;
    iVar29 = (pIVar10->TablesTempDataStack).Capacity;
    if (iVar29 < iVar26) {
      if (iVar29 == 0) {
        iVar29 = 8;
      }
      else {
        iVar29 = iVar29 / 2 + iVar29;
      }
      if (iVar29 <= iVar26) {
        iVar29 = iVar26;
      }
      pIVar18 = (ImGuiTableTempData *)MemAlloc((long)iVar29 * 0x90);
      pIVar6 = (pIVar10->TablesTempDataStack).Data;
      if (pIVar6 != (ImGuiTableTempData *)0x0) {
        memcpy(pIVar18,pIVar6,(long)(pIVar10->TablesTempDataStack).Size * 0x90);
        MemFree((pIVar10->TablesTempDataStack).Data);
      }
      (pIVar10->TablesTempDataStack).Data = pIVar18;
      (pIVar10->TablesTempDataStack).Capacity = iVar29;
      iVar27 = (pIVar10->TablesTempDataStack).Size;
    }
    if (iVar27 < iVar26) {
      lVar32 = ((long)iVar31 - (long)iVar27) + 2;
      lVar30 = (long)iVar27 * 0x90;
      do {
        memcpy((void *)((long)&((pIVar10->TablesTempDataStack).Data)->TableIndex + lVar30),&local_c8
               ,0x90);
        lVar30 = lVar30 + 0x90;
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
    }
    (pIVar10->TablesTempDataStack).Size = iVar26;
    if (local_88 != (void *)0x0) {
      MemFree(local_88);
    }
    ImDrawListSplitter::ClearFreeMemory(&local_b8);
    if (local_b8._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_b8._Channels.Data);
    }
    uVar14 = pIVar10->CurrentTableStackIdx;
    iVar27 = (pIVar10->TablesTempDataStack).Size;
  }
  pIVar5 = local_f8;
  if (((int)uVar14 < 0) || (iVar27 <= (int)uVar14)) {
    pcVar23 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
    goto LAB_001897c2;
  }
  pIVar18 = (pIVar10->TablesTempDataStack).Data;
  pIVar6 = pIVar18 + uVar14;
  p_00->TempData = pIVar6;
  pIVar18 = pIVar18 + uVar14;
  pIVar19 = &pIVar18->DrawSplitter;
  pIVar18->TableIndex = uVar13;
  p_00->DrawSplitter = pIVar19;
  pIVar19->_Current = 0;
  pIVar19->_Count = 1;
  uVar15 = flags & 0xe000;
  p_00->IsDefaultSizingPolicy = uVar15 == 0;
  uVar14 = flags;
  if (uVar15 == 0) {
    uVar15 = 0x2000;
    if ((((uint)flags >> 0x18 & 1) == 0) && (uVar15 = 0x2000, (local_f8->Flags & 0x40) == 0)) {
      uVar15 = 0x8000;
    }
    uVar14 = uVar15 | flags;
  }
  uVar16 = uVar14 | 0x40000;
  if (uVar15 != 0x4000) {
    uVar16 = uVar14;
  }
  uVar14 = uVar16 & 0xfffcffff;
  if ((uVar16 & 0x3000000) == 0) {
    uVar14 = uVar16;
  }
  uVar15 = uVar14 & 0xfffff7ff;
  if ((uVar14 >> 0xc & 1) == 0) {
    uVar15 = uVar14;
  }
  uVar14 = (uVar16 & 1) << 9 | uVar15;
  uVar16 = uVar14 | 0x10;
  if ((uVar15 & 0xf) == 0) {
    uVar14 = uVar16;
  }
  if (((uint)local_f8->RootWindow->Flags >> 8 & 1) != 0) {
    uVar14 = uVar16;
  }
  p_00->ID = (ImGuiID)local_f0;
  p_00->Flags = uVar14;
  p_00->InstanceCurrent = local_118;
  p_00->LastFrameActive = pIVar10->FrameCount;
  p_00->InnerWindow = local_f8;
  p_00->OuterWindow = local_f8;
  p_00->ColumnsCount = columns_count;
  p_00->IsLayoutLocked = false;
  p_00->InnerWidth = (float)local_e8;
  pIVar6->UserOuterSize = *local_d0;
  if ((flags & 0x3000000U) == 0) {
    (p_00->InnerRect).Min = local_108.Min;
    (p_00->InnerRect).Max = local_108.Max;
    (p_00->OuterRect).Min = local_108.Min;
    (p_00->OuterRect).Max = local_108.Max;
    (p_00->WorkRect).Min = local_108.Min;
    (p_00->WorkRect).Max = local_108.Max;
  }
  else {
    fVar38 = (float)local_e8;
    if ((uVar14 & 0x1000000) == 0) {
      fVar38 = 3.4028235e+38;
    }
    fVar38 = (float)(~-(uint)(0.0 < (float)local_e8) & 0x7f7fffff |
                    (uint)fVar38 & -(uint)(0.0 < (float)local_e8));
    if (fVar38 != 3.4028235e+38 || (uVar14 & 0x3000000) == 0x1000000) {
      if ((uVar14 & 0x3000000) == 0x1000000) {
        local_c8.y = 1.1754944e-38;
      }
      else {
        local_c8.y = 0.0;
      }
      local_c8.x = (float)(-(uint)(fVar38 != 3.4028235e+38) & (uint)fVar38);
      SetNextWindowContentSize(&local_c8);
    }
    if ((local_124 & 0x3000000) == 0) {
      local_c8.x = 0.0;
      local_c8.y = 0.0;
      SetNextWindowScroll(&local_c8);
    }
    local_c8.x = local_108.Max.x - local_108.Min.x;
    local_c8.y = local_108.Max.y - local_108.Min.y;
    BeginChildEx(local_d8,local_128,&local_c8,false,(uVar14 & 0x1000000) >> 0xd);
    pIVar7 = pIVar10->CurrentWindow;
    p_00->InnerWindow = pIVar7;
    IVar34 = (pIVar7->WorkRect).Max;
    (p_00->WorkRect).Min = (pIVar7->WorkRect).Min;
    (p_00->WorkRect).Max = IVar34;
    IVar34 = pIVar7->Pos;
    IVar35.x = (pIVar7->Size).x + IVar34.x;
    IVar35.y = (pIVar7->Size).y + IVar34.y;
    (p_00->OuterRect).Min = IVar34;
    (p_00->OuterRect).Max = IVar35;
    IVar34 = (pIVar7->InnerRect).Max;
    (p_00->InnerRect).Min = (pIVar7->InnerRect).Min;
    (p_00->InnerRect).Max = IVar34;
    if (((((pIVar7->WindowPadding).x != 0.0) || (fVar38 = (pIVar7->WindowPadding).y, fVar38 != 0.0))
        || (NAN(fVar38))) || ((pIVar7->WindowBorderSize != 0.0 || (NAN(pIVar7->WindowBorderSize)))))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x191,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(local_128);
  pIVar7 = p_00->InnerWindow;
  p_00->HostIndentX = (pIVar7->DC).Indent.x;
  IVar34 = (pIVar7->ClipRect).Max;
  (p_00->HostClipRect).Min = (pIVar7->ClipRect).Min;
  (p_00->HostClipRect).Max = IVar34;
  p_00->HostSkipItems = pIVar7->SkipItems;
  IVar34 = (pIVar7->WorkRect).Max;
  (pIVar6->HostBackupWorkRect).Min = (pIVar7->WorkRect).Min;
  (pIVar6->HostBackupWorkRect).Max = IVar34;
  IVar34 = (pIVar7->ParentWorkRect).Max;
  (pIVar6->HostBackupParentWorkRect).Min = (pIVar7->ParentWorkRect).Min;
  (pIVar6->HostBackupParentWorkRect).Max = IVar34;
  (pIVar6->HostBackupColumnsOffset).x = (pIVar5->DC).ColumnsOffset.x;
  pIVar6->HostBackupPrevLineSize = (pIVar7->DC).PrevLineSize;
  pIVar6->HostBackupCurrLineSize = (pIVar7->DC).CurrLineSize;
  pIVar6->HostBackupCursorMaxPos = (pIVar7->DC).CursorMaxPos;
  pIVar6->HostBackupItemWidth = (pIVar5->DC).ItemWidth;
  pIVar6->HostBackupItemWidthStackSize = (pIVar5->DC).ItemWidthStack.Size;
  fVar38 = 0.0;
  fVar40 = 0.0;
  if ((uVar14 >> 9 & 1) != 0) {
    fVar40 = 1.0;
  }
  (pIVar7->DC).CurrLineSize.x = 0.0;
  (pIVar7->DC).CurrLineSize.y = 0.0;
  (pIVar7->DC).PrevLineSize.x = 0.0;
  (pIVar7->DC).PrevLineSize.y = 0.0;
  if ((uVar14 & 0x800200) == 0x200) {
    fVar38 = (pIVar10->Style).CellPadding.x;
LAB_001890e8:
    fVar39 = 0.0;
  }
  else {
    if ((uVar14 & 0x800200) != 0) goto LAB_001890e8;
    fVar39 = (pIVar10->Style).CellPadding.x;
  }
  p_00->CellSpacingX1 = fVar40 + fVar39;
  p_00->CellSpacingX2 = fVar39;
  p_00->CellPaddingX = fVar38;
  p_00->CellPaddingY = (pIVar10->Style).CellPadding.y;
  fVar40 = 0.0;
  fVar39 = 0.0;
  if ((uVar14 >> 10 & 1) != 0) {
    fVar39 = 1.0;
  }
  if ((uVar14 >> 0x16 & 1) == 0 && (uVar14 & 0x200400) != 0) {
    fVar40 = (pIVar10->Style).CellPadding.x;
  }
  p_00->OuterPaddingX = (fVar39 + fVar40) - fVar38;
  p_00->CurrentRow = -1;
  p_00->CurrentColumn = -1;
  p_00->RowBgColorCounter = 0;
  *(uint *)&p_00->field_0x98 = (uint)*(ushort *)&p_00->field_0x98;
  pIVar22 = &pIVar7->ClipRect;
  if (pIVar7 == pIVar5) {
    pIVar22 = &p_00->WorkRect;
  }
  IVar34 = pIVar22->Max;
  (p_00->InnerClipRect).Min = pIVar22->Min;
  (p_00->InnerClipRect).Max = IVar34;
  IVar34 = (p_00->InnerClipRect).Min;
  auVar36._8_8_ = 0;
  auVar36._0_4_ = (p_00->InnerClipRect).Max.x;
  auVar36._4_4_ = (p_00->InnerClipRect).Max.y;
  IVar35 = (p_00->WorkRect).Min;
  fVar39 = IVar35.x;
  fVar41 = IVar35.y;
  auVar42._8_8_ = 0;
  auVar42._0_4_ = (p_00->WorkRect).Max.x;
  auVar42._4_4_ = (p_00->WorkRect).Max.y;
  auVar37 = minps(auVar36,auVar42);
  fVar38 = IVar34.x;
  fVar40 = IVar34.y;
  uVar15 = -(uint)(fVar39 <= fVar38);
  uVar16 = -(uint)(fVar41 <= fVar40);
  (p_00->InnerClipRect).Min =
       (ImVec2)(CONCAT44(~uVar16 & (uint)fVar41,~uVar15 & (uint)fVar39) |
               CONCAT44((uint)fVar40 & uVar16,(uint)fVar38 & uVar15));
  (p_00->InnerClipRect).Max = auVar37._0_8_;
  ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
  if ((uVar14 >> 0x11 & 1) == 0) {
    fVar38 = (pIVar7->ClipRect).Max.y;
  }
  else {
    fVar38 = (p_00->InnerClipRect).Max.y;
    fVar40 = (pIVar7->WorkRect).Max.y;
    if (fVar40 <= fVar38) {
      fVar38 = fVar40;
    }
  }
  (p_00->InnerClipRect).Max.y = fVar38;
  fVar38 = (p_00->WorkRect).Min.y;
  p_00->RowPosY2 = fVar38;
  p_00->RowPosY1 = fVar38;
  p_00->RowTextBaseline = 0.0;
  p_00->FreezeRowsRequest = '\0';
  p_00->FreezeRowsCount = '\0';
  p_00->FreezeColumnsRequest = '\0';
  p_00->FreezeColumnsCount = '\0';
  p_00->IsUnfrozenRows = true;
  p_00->DeclColumnsCount = '\0';
  IVar17 = GetColorU32(0x2b,1.0);
  p_00->BorderColorStrong = IVar17;
  IVar17 = GetColorU32(0x2c,1.0);
  p_00->BorderColorLight = IVar17;
  pIVar10->CurrentTable = p_00;
  (pIVar5->DC).CurrentTableIdx = uVar13;
  if (pIVar7 != pIVar5) {
    (pIVar7->DC).CurrentTableIdx = uVar13;
  }
  if (((local_124 & 2) != 0) && ((uVar14 & 2) == 0)) {
    p_00->IsResetDisplayOrderRequest = true;
  }
  iVar31 = (pIVar10->TablesLastTimeActive).Size;
  local_e8 = pIVar7;
  if (iVar31 <= (int)uVar13) {
    iVar26 = uVar13 + 1;
    iVar27 = (pIVar10->TablesLastTimeActive).Capacity;
    if (iVar27 <= (int)uVar13) {
      if (iVar27 == 0) {
        iVar27 = 8;
      }
      else {
        iVar27 = iVar27 / 2 + iVar27;
      }
      if (iVar27 <= iVar26) {
        iVar27 = iVar26;
      }
      __dest = (float *)MemAlloc((long)iVar27 << 2);
      __src = (pIVar10->TablesLastTimeActive).Data;
      if (__src != (float *)0x0) {
        memcpy(__dest,__src,(long)(pIVar10->TablesLastTimeActive).Size << 2);
        MemFree((pIVar10->TablesLastTimeActive).Data);
      }
      (pIVar10->TablesLastTimeActive).Data = __dest;
      (pIVar10->TablesLastTimeActive).Capacity = iVar27;
      iVar31 = (pIVar10->TablesLastTimeActive).Size;
    }
    if (iVar31 <= (int)uVar13) {
      lVar30 = (long)iVar31;
      do {
        (pIVar10->TablesLastTimeActive).Data[lVar30] = -1.0;
        lVar30 = lVar30 + 1;
      } while (iVar26 != lVar30);
    }
    (pIVar10->TablesLastTimeActive).Size = iVar26;
    iVar31 = iVar26;
  }
  if (((int)uVar13 < 0) || (iVar31 <= (int)uVar13)) {
    pcVar23 = "T &ImVector<float>::operator[](int) [T = float]";
LAB_001897c2:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x68b,pcVar23);
  }
  dVar3 = pIVar10->Time;
  (pIVar10->TablesLastTimeActive).Data[uVar13] = (float)dVar3;
  pIVar6->LastTimeActive = (float)dVar3;
  p_00->MemoryCompacted = false;
  pvVar8 = p_00->RawData;
  pIVar21 = (p_00->Columns).Data;
  iVar31 = (int)((long)(p_00->Columns).DataEnd - (long)pIVar21 >> 3) * -0x3b13b13b;
  if (iVar31 == columns_count || iVar31 == 0) {
    pIVar21 = (ImGuiTableColumn *)0x0;
    ptr = (void *)0x0;
    pvVar11 = (void *)0x0;
    if (pvVar8 == (void *)0x0) goto LAB_00189422;
  }
  else {
    p_00->RawData = (void *)0x0;
    pvVar11 = pvVar8;
LAB_00189422:
    ptr = pvVar11;
    TableBeginInitMemory(p_00,columns_count);
    p_00->IsSettingsRequestLoad = true;
    p_00->IsInitializing = true;
  }
  if (p_00->IsResetAllRequest == true) {
    p_00->IsInitializing = true;
    p_00->IsResetAllRequest = false;
    p_00->IsSettingsRequestLoad = false;
    p_00->IsSettingsDirty = true;
    p_00->SettingsLoadedFlags = 0;
  }
  else if ((p_00->IsInitializing & 1U) == 0) goto LAB_001895f0;
  p_00->SettingsOffset = -1;
  p_00->IsSortSpecsDirty = true;
  p_00->InstanceInteracted = -1;
  p_00->ContextPopupColumn = -1;
  p_00->ReorderColumn = -1;
  p_00->HoveredColumnBody = -1;
  p_00->HoveredColumnBorder = -1;
  p_00->AutoFitSingleColumn = -1;
  p_00->ResizedColumn = -1;
  p_00->LastResizedColumn = -1;
  if (0 < columns_count) {
    lVar30 = 0x60;
    uVar20 = 0;
    do {
      pIVar9 = (p_00->Columns).Data;
      pIVar25 = (ImGuiTableColumn *)((long)pIVar9 + lVar30 + -0x60);
      if ((p_00->Columns).DataEnd <= pIVar25) goto LAB_00189703;
      if ((pIVar21 == (ImGuiTableColumn *)0x0) || ((long)iVar31 <= (long)uVar20)) {
        uVar2 = *(undefined4 *)((long)pIVar9 + lVar30 + -0x4c);
        local_b8._Channels.Data = (ImDrawChannel *)0x0;
        uStack_a0 = 0;
        uStack_9d = 0;
        local_b8._Current = 0;
        local_b8._Count = 0;
        local_b8._Channels.Size = 0;
        local_b8._Channels.Capacity = 0;
        local_c8.x = 0.0;
        local_c8.y = 0.0;
        uStack_c0 = 0;
        local_98 = 0;
        uStack_90 = 0xffffff;
        local_94 = 0xffffffff;
        pIVar25->Flags = 0;
        pIVar25->WidthGiven = 0.0;
        *(undefined8 *)((long)pIVar9 + lVar30 + -0x58) = 0;
        *(undefined4 *)((long)pIVar9 + lVar30 + -0x50) = 0xbf800000;
        *(undefined4 *)((long)pIVar9 + lVar30 + -0x48) = 0xbf800000;
        puVar1 = (undefined8 *)((long)pIVar9 + lVar30 + -0x44);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar9 + lVar30 + -0x34);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar9 + lVar30 + -0x24);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar9 + lVar30 + -0x19);
        *puVar1 = 0;
        puVar1[1] = 0xffffffffffffff00;
        *(undefined8 *)((long)pIVar9 + lVar30 + -4) = 0;
        *(undefined2 *)((long)&pIVar9->WidthGiven + lVar30) = 0;
        *(undefined4 *)((long)pIVar9 + lVar30 + -0x4c) = uVar2;
        *(undefined1 *)((long)&pIVar9->Flags + lVar30) = 1;
        *(undefined1 *)((long)pIVar9 + lVar30 + -5) = 1;
        *(undefined4 *)((long)pIVar9 + lVar30 + -9) = 0x1ffffff;
      }
      else {
        pIVar28 = (ImGuiTableColumnFlags *)((long)pIVar21 + lVar30 + -0x60);
        for (lVar32 = 0x19; lVar32 != 0; lVar32 = lVar32 + -1) {
          pIVar25->Flags = *pIVar28;
          pIVar28 = pIVar28 + (ulong)bVar33 * -2 + 1;
          pIVar25 = (ImGuiTableColumn *)((long)pIVar25 + (ulong)bVar33 * -8 + 4);
        }
        *(undefined2 *)((long)&pIVar9->WidthGiven + lVar30) =
             *(undefined2 *)((long)&pIVar21->WidthGiven + lVar30);
      }
      pcVar23 = (p_00->DisplayOrderToIndex).Data + uVar20;
      if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar23) {
        pcVar23 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
        goto LAB_0018972f;
      }
      *pcVar23 = (char)uVar20;
      *(char *)((long)pIVar9 + lVar30 + -0xe) = (char)uVar20;
      uVar20 = uVar20 + 1;
      lVar30 = lVar30 + 0x68;
    } while (uVar24 != uVar20);
  }
LAB_001895f0:
  if (ptr != (void *)0x0) {
    MemFree(ptr);
  }
  if (p_00->IsSettingsRequestLoad == true) {
    TableLoadSettings(p_00);
  }
  fVar38 = pIVar10->FontSize;
  fVar40 = p_00->RefScale;
  if ((fVar40 != 0.0) || (NAN(fVar40))) {
    if (((fVar40 != fVar38) || (NAN(fVar40) || NAN(fVar38))) && (0 < columns_count)) {
      pIVar21 = (p_00->Columns).Data;
      do {
        if ((p_00->Columns).DataEnd <= pIVar21) {
LAB_00189703:
          pcVar23 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0018972f:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                        ,0x23b,pcVar23);
        }
        pIVar21->WidthRequest = pIVar21->WidthRequest * (fVar38 / fVar40);
        pIVar21 = pIVar21 + 1;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
    }
  }
  p_00->RefScale = fVar38;
  local_e8->SkipItems = true;
  if (0 < (p_00->ColumnsNames).Buf.Size) {
    if ((p_00->ColumnsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      pcVar23 = (p_00->ColumnsNames).Buf.Data;
      if (pcVar23 != (char *)0x0) {
        memcpy(__dest_00,pcVar23,(long)(p_00->ColumnsNames).Buf.Size);
        MemFree((p_00->ColumnsNames).Buf.Data);
      }
      (p_00->ColumnsNames).Buf.Data = __dest_00;
      (p_00->ColumnsNames).Buf.Capacity = 0;
    }
    (p_00->ColumnsNames).Buf.Size = 0;
  }
  TableBeginApplyRequests(p_00);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStackIdx++;
    if (g.CurrentTableStackIdx + 1 > g.TablesTempDataStack.Size)
        g.TablesTempDataStack.resize(g.CurrentTableStackIdx + 1, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempDataStack[g.CurrentTableStackIdx];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}